

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::ContainerCompressionState::OverrideRun
          (ContainerCompressionState *this,data_ptr_t *destination,idx_t count)

{
  data_ptr_t pdVar1;
  long lVar2;
  
  this->append_function = AppendRun;
  pdVar1 = *destination;
  if (count < 4) {
    pdVar1 = (data_ptr_t)((ulong)(pdVar1 + 3) & 0xfffffffffffffffc);
    *destination = pdVar1;
    lVar2 = 0x10;
  }
  else {
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
    pdVar1 = *destination;
    this->run_counts = pdVar1;
    pdVar1 = pdVar1 + 8;
    lVar2 = 0x18;
  }
  *(data_ptr_t *)((long)this->compressed_arrays + lVar2 + -0x20) = pdVar1;
  return;
}

Assistant:

void ContainerCompressionState::OverrideRun(data_ptr_t &destination, idx_t count) {
	append_function = AppendRun;

	if (count >= COMPRESSED_RUN_THRESHOLD) {
		memset(destination, 0, sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT);
		run_counts = reinterpret_cast<uint8_t *>(destination);
		auto data_start = destination + sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT;
		compressed_runs = reinterpret_cast<uint8_t *>(data_start);
	} else {
		destination = AlignValue<sizeof(RunContainerRLEPair)>(destination);
		runs = reinterpret_cast<RunContainerRLEPair *>(destination);
	}
}